

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_compute_blob.h
# Opt level: O0

void ncnn::gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar13;
  float __x;
  float fVar14;
  bool v3_in_bound_1;
  bool v2_in_bound_1;
  bool v1_in_bound_1;
  bool v0_in_bound_1;
  bool y_in_range_1;
  int offset_y_1;
  int gy_1;
  int i_1;
  int *offset_ptr_1;
  bool x3_in_range_1;
  bool x2_in_range_1;
  bool x0_in_range_1;
  bool x1_in_range_1;
  int x3_1;
  int x2_1;
  int x0_1;
  int y1_1;
  int x1_1;
  float sample_y_1;
  float sample_x_1;
  int x_1;
  float *gridptr_y;
  float *gridptr_x;
  bool v3_in_bound;
  bool v2_in_bound;
  bool v1_in_bound;
  bool v0_in_bound;
  bool y_in_range;
  int offset_y;
  int gy;
  int i;
  int *offset_ptr;
  bool x3_in_range;
  bool x2_in_range;
  bool x0_in_range;
  bool x1_in_range;
  int x3;
  int x2;
  int x0;
  int y1;
  int x1;
  float sample_y;
  float sample_x;
  int x;
  float *gridptr;
  int y;
  compute_coord<(ncnn::GridSample::PaddingMode)1,_true> get_coord;
  grid_sample_unormalize<true> unormalize;
  float *offset_value_ptr;
  int grid_size;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  double local_578;
  double local_570;
  double local_568;
  double local_560;
  double local_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  int local_484;
  float *local_480;
  int local_454;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined4 local_438;
  long local_430;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined8 local_410;
  float *local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  long local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined8 local_3c0;
  float *local_3b8;
  undefined1 local_3a9;
  undefined1 local_3a8;
  undefined1 local_3a7;
  undefined1 local_3a6;
  undefined1 local_3a5;
  int local_3a4;
  uint local_3a0;
  int local_39c;
  float *local_398;
  byte local_38c;
  byte local_38b;
  byte local_38a;
  byte local_389;
  uint local_388;
  uint local_384;
  uint local_380;
  int local_37c;
  uint local_378;
  float local_374;
  float local_370;
  int local_36c;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_350;
  long local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  float *local_320;
  int local_318;
  compute_coord<(ncnn::GridSample::PaddingMode)1,_true> local_312;
  grid_sample_unormalize<true> local_311;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  long local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined8 local_2d0;
  float *local_2c8;
  int local_2c0;
  long *local_2b0;
  long local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined1 local_21d;
  undefined4 local_21c;
  undefined8 *local_210;
  undefined1 local_1e5;
  undefined4 local_1e4;
  undefined8 *local_1d8;
  undefined1 local_1ad;
  int local_1ac;
  undefined8 *local_1a0;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined1 local_15d;
  undefined4 local_15c;
  undefined8 *local_150;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  float *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  float *local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_2c0 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
  local_150 = &local_310;
  local_f4 = *(int *)((long)in_RDX + 0x2c);
  local_f8 = (int)in_RDX[6];
  local_fc = *(undefined4 *)((long)in_RDX + 0x34);
  local_2c8 = (float *)*in_RDX;
  local_110 = in_RDX[2];
  local_114 = (undefined4)in_RDX[3];
  local_120 = in_RDX[4];
  local_f0 = &local_310;
  local_8 = (long)local_f4 * (long)local_f8 * local_110;
  local_128 = &local_310;
  local_2a0 = &local_310;
  local_c = 0x10;
  local_15c = 0;
  local_15d = 1;
  local_310 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_2e8 = 0;
  local_2e4 = 0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_308 = 0;
  local_2a8 = in_RDI;
  local_248 = local_2a0;
  local_108 = local_2c8;
  local_2f0 = local_120;
  if (in_ECX == 0) {
    local_2b0 = in_RSI;
    for (local_318 = 0; local_318 < (int)local_2b0[7]; local_318 = local_318 + 1) {
      local_1a0 = &local_368;
      local_bc = *(int *)((long)local_2b0 + 0x2c);
      local_c0 = (int)local_2b0[6];
      local_c4 = *(undefined4 *)((long)local_2b0 + 0x34);
      local_320 = (float *)(*local_2b0 + local_2b0[8] * (long)local_318 * local_2b0[2]);
      local_d8 = local_2b0[2];
      local_dc = (undefined4)local_2b0[3];
      local_e8 = local_2b0[4];
      local_b8 = &local_368;
      local_18 = (long)local_bc * (long)local_c0 * local_d8;
      local_168 = &local_368;
      local_298 = &local_368;
      local_1c = 0x10;
      local_1ac = local_318;
      local_1ad = 1;
      local_368 = 0;
      local_358 = 0;
      local_350 = 0;
      local_340 = 0;
      local_33c = 0;
      local_338 = 0;
      local_334 = 0;
      local_330 = 0;
      local_328 = 0;
      local_360 = 0;
      local_258 = local_298;
      local_d0 = local_320;
      local_348 = local_e8;
      for (local_36c = 0; local_36c < local_2c0; local_36c = local_36c + 2) {
        local_370 = *local_320;
        local_374 = local_320[1];
        local_370 = grid_sample_unormalize<true>::operator()
                              (&local_311,*(int *)(local_2a8 + 0x2c),local_370);
        local_374 = grid_sample_unormalize<true>::operator()
                              (&local_311,*(int *)(local_2a8 + 0x30),local_374);
        fVar13 = floorf(local_370);
        local_378 = (uint)fVar13;
        fVar13 = floorf(local_374);
        local_37c = (int)fVar13;
        local_380 = local_378 + -1;
        local_384 = local_378 + 1;
        local_388 = local_378 + 2;
        *local_2c8 = local_370 - (float)(int)local_378;
        local_2c8[1] = local_374 - (float)local_37c;
        fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                           (&local_312,*(int *)(local_2a8 + 0x2c),(float)(int)local_378);
        local_378 = (uint)fVar13;
        fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                           (&local_312,*(int *)(local_2a8 + 0x2c),(float)(int)local_380);
        local_380 = (uint)fVar13;
        fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                           (&local_312,*(int *)(local_2a8 + 0x2c),(float)(int)local_384);
        local_384 = (uint)fVar13;
        fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                           (&local_312,*(int *)(local_2a8 + 0x2c),(float)(int)local_388);
        local_388 = (uint)fVar13;
        local_389 = local_378 < 0x80000000 && (int)local_378 < *(int *)(local_2a8 + 0x2c);
        local_38a = local_380 < 0x80000000 && (int)local_380 < *(int *)(local_2a8 + 0x2c);
        local_38b = local_384 < 0x80000000 && (int)local_384 < *(int *)(local_2a8 + 0x2c);
        local_38c = local_388 < 0x80000000 && (int)local_388 < *(int *)(local_2a8 + 0x2c);
        local_398 = local_2c8 + 2;
        for (local_39c = 0; local_39c < 4; local_39c = local_39c + 1) {
          local_3a0 = local_37c + local_39c + -1;
          fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                             (&local_312,*(int *)(local_2a8 + 0x30),(float)(int)local_3a0);
          local_3a0 = (uint)fVar13;
          local_3a4 = local_3a0 * *(int *)(local_2a8 + 0x2c);
          local_3a5 = local_3a0 < 0x80000000 && (int)local_3a0 < *(int *)(local_2a8 + 0x30);
          local_3a6 = (local_38a & 1 & local_3a5) != 0;
          local_3a7 = (local_389 & 1 & local_3a5) != 0;
          local_3a8 = (local_38b & 1 & local_3a5) != 0;
          local_3a9 = (local_38c & 1 & local_3a5) != 0;
          if ((bool)local_3a6) {
            local_4f0 = (double)(int)((local_3a4 + local_380) * *(int *)(local_2a8 + 0x18));
          }
          else {
            local_4f0 = -1.0;
          }
          *local_398 = (float)(int)local_4f0;
          if ((bool)local_3a7) {
            local_4f8 = (double)(int)((local_3a4 + local_378) * *(int *)(local_2a8 + 0x18));
          }
          else {
            local_4f8 = -1.0;
          }
          local_398[1] = (float)(int)local_4f8;
          if ((bool)local_3a8) {
            local_500 = (double)(int)((local_3a4 + local_384) * *(int *)(local_2a8 + 0x18));
          }
          else {
            local_500 = -1.0;
          }
          local_398[2] = (float)(int)local_500;
          if ((bool)local_3a9) {
            local_508 = (double)(int)((local_3a4 + local_388) * *(int *)(local_2a8 + 0x18));
          }
          else {
            local_508 = -1.0;
          }
          local_398[3] = (float)(int)local_508;
          local_398 = local_398 + 4;
        }
        local_320 = local_320 + 2;
        local_2c8 = local_2c8 + 0x12;
      }
    }
  }
  else {
    local_1d8 = &local_400;
    local_84 = *(int *)((long)in_RSI + 0x2c);
    local_88 = (int)in_RSI[6];
    local_8c = *(undefined4 *)((long)in_RSI + 0x34);
    local_3b8 = (float *)*in_RSI;
    local_a0 = in_RSI[2];
    local_a4 = (undefined4)in_RSI[3];
    local_b0 = in_RSI[4];
    local_80 = &local_400;
    local_28 = (long)local_84 * (long)local_88 * local_a0;
    local_170 = &local_400;
    local_290 = &local_400;
    local_210 = &local_450;
    local_4c = *(int *)((long)in_RSI + 0x2c);
    local_50 = (int)in_RSI[6];
    local_54 = *(undefined4 *)((long)in_RSI + 0x34);
    local_408 = (float *)(*in_RSI + in_RSI[8] * in_RSI[2]);
    local_68 = in_RSI[2];
    local_6c = (undefined4)in_RSI[3];
    local_78 = in_RSI[4];
    local_48 = &local_450;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_178 = &local_450;
    local_288 = &local_450;
    local_2d8 = 0;
    local_2dc = 0;
    local_2e0 = 0;
    local_2e4 = 0;
    local_2f8 = 0;
    local_300 = 0;
    local_308 = 0;
    local_310 = 0;
    local_3c8 = 0;
    local_3cc = 0;
    local_3d0 = 0;
    local_3d4 = 0;
    local_3e8 = 0;
    local_3f0 = 0;
    local_3f8 = 0;
    local_400 = 0;
    local_c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_15c = 0;
    local_15d = 1;
    local_1e4 = 0;
    local_1e5 = 1;
    local_21c = 1;
    local_21d = 1;
    local_2d0 = 0;
    local_2e8 = 0;
    local_3c0 = 0;
    local_3d8 = 0;
    local_450 = 0;
    local_440 = 0;
    local_438 = 0;
    local_428 = 0;
    local_424 = 0;
    local_420 = 0;
    local_41c = 0;
    local_418 = 0;
    local_410 = 0;
    local_448 = 0;
    local_278 = local_288;
    local_268 = local_290;
    local_98 = local_3b8;
    local_60 = local_408;
    local_430 = local_78;
    local_3e0 = local_b0;
    for (local_454 = 0; local_454 < local_2c0; local_454 = local_454 + 1) {
      fVar13 = *local_408;
      __x = grid_sample_unormalize<true>::operator()
                      (&local_311,*(int *)(local_2a8 + 0x2c),*local_3b8);
      fVar13 = grid_sample_unormalize<true>::operator()
                         (&local_311,*(int *)(local_2a8 + 0x30),fVar13);
      fVar14 = floorf(__x);
      iVar6 = (int)fVar14;
      fVar14 = floorf(fVar13);
      *local_2c8 = __x - (float)iVar6;
      local_2c8[1] = fVar13 - (float)(int)fVar14;
      fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                         (&local_312,*(int *)(local_2a8 + 0x2c),(float)iVar6);
      uVar7 = (uint)fVar13;
      fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                         (&local_312,*(int *)(local_2a8 + 0x2c),(float)(iVar6 + -1));
      uVar8 = (uint)fVar13;
      fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                         (&local_312,*(int *)(local_2a8 + 0x2c),(float)(iVar6 + 1));
      uVar9 = (uint)fVar13;
      fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                         (&local_312,*(int *)(local_2a8 + 0x2c),(float)(iVar6 + 2));
      uVar10 = (uint)fVar13;
      iVar6 = *(int *)(local_2a8 + 0x2c);
      iVar1 = *(int *)(local_2a8 + 0x2c);
      iVar2 = *(int *)(local_2a8 + 0x2c);
      iVar3 = *(int *)(local_2a8 + 0x2c);
      local_480 = local_2c8 + 2;
      for (local_484 = 0; local_484 < 4; local_484 = local_484 + 1) {
        fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)1,_true>::operator()
                           (&local_312,*(int *)(local_2a8 + 0x30),
                            (float)((int)fVar14 + local_484 + -1));
        uVar11 = (uint)fVar13;
        iVar12 = uVar11 * *(int *)(local_2a8 + 0x2c);
        bVar5 = 0x7fffffff < uVar11;
        bVar4 = *(int *)(local_2a8 + 0x30) <= (int)uVar11;
        if ((0x7fffffff < uVar8 || iVar1 <= (int)uVar8) || (bVar5 || bVar4)) {
          local_560 = -1.0;
        }
        else {
          local_560 = (double)(int)((iVar12 + uVar8) * *(int *)(local_2a8 + 0x18));
        }
        *local_480 = (float)(int)local_560;
        if ((0x7fffffff < uVar7 || iVar6 <= (int)uVar7) || (bVar5 || bVar4)) {
          local_568 = -1.0;
        }
        else {
          local_568 = (double)(int)((iVar12 + uVar7) * *(int *)(local_2a8 + 0x18));
        }
        local_480[1] = (float)(int)local_568;
        if ((0x7fffffff < uVar9 || iVar2 <= (int)uVar9) || (bVar5 || bVar4)) {
          local_570 = -1.0;
        }
        else {
          local_570 = (double)(int)((iVar12 + uVar9) * *(int *)(local_2a8 + 0x18));
        }
        local_480[2] = (float)(int)local_570;
        if ((0x7fffffff < uVar10 || iVar3 <= (int)uVar10) || (bVar5 || bVar4)) {
          local_578 = -1.0;
        }
        else {
          local_578 = (double)(int)((iVar12 + uVar10) * *(int *)(local_2a8 + 0x18));
        }
        local_480[3] = (float)(int)local_578;
        local_480 = local_480 + 4;
      }
      local_3b8 = local_3b8 + 1;
      local_408 = local_408 + 1;
      local_2c8 = local_2c8 + 0x12;
    }
  }
  return;
}

Assistant:

void gridsample_2d_bicubic_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gy = unormalize(_mm256_set1_ps(src.h), gy);

                __m256 gx_floor = _mm256_floor_ps(gx);
                __m256 gy_floor = _mm256_floor_ps(gy);

                __m256 tx = _mm256_sub_ps(gx, gx_floor);
                __m256 ty = _mm256_sub_ps(gy, gy_floor);

                __m256 gx0 = _mm256_add_ps(gx_floor, _mm256_set1_ps(-1));
                __m256 gx1 = gx_floor;
                __m256 gx2 = _mm256_add_ps(gx_floor, _mm256_set1_ps(1));
                __m256 gx3 = _mm256_add_ps(gx2, _mm256_set1_ps(1));

                gx0 = get_coord(_mm256_set1_ps(src.w), gx0);
                gx1 = get_coord(_mm256_set1_ps(src.w), gx1);
                gx2 = get_coord(_mm256_set1_ps(src.w), gx2);
                gx3 = get_coord(_mm256_set1_ps(src.w), gx3);

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(gx0, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx0, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(gx1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx1, _CMP_GT_OS));
                __m256 x2_in_range = _mm256_and_ps(_mm256_cmp_ps(gx2, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx2, _CMP_GT_OS));
                __m256 x3_in_range = _mm256_and_ps(_mm256_cmp_ps(gx3, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx3, _CMP_GT_OS));
                __m256 v0_offset_f[4], v1_offset_f[4], v2_offset_f[4], v3_offset_f[4];
                for (int i = 0; i < 4; i++)
                {
                    gy = _mm256_add_ps(gy_floor, _mm256_set1_ps(-1.0f + i));
                    gy = get_coord(_mm256_set1_ps(src.h), gy);

                    __m256 y_in_range = _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS));

                    __m256 gy_offset = _mm256_mul_ps(gy, _mm256_set1_ps(src.w));

                    v0_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx0), _mm256_set1_ps(src.elempack));
                    v1_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx1), _mm256_set1_ps(src.elempack));
                    v2_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx2), _mm256_set1_ps(src.elempack));
                    v3_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx3), _mm256_set1_ps(src.elempack));

                    v0_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v0_offset_f[i], _mm256_and_ps(x0_in_range, y_in_range));
                    v1_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v1_offset_f[i], _mm256_and_ps(x1_in_range, y_in_range));
                    v2_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v2_offset_f[i], _mm256_and_ps(x2_in_range, y_in_range));
                    v3_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v3_offset_f[i], _mm256_and_ps(x3_in_range, y_in_range));

                    v0_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v0_offset_f[i]));
                    v1_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v1_offset_f[i]));
                    v2_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v2_offset_f[i]));
                    v3_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v3_offset_f[i]));
                }

                transpose8x18_ps(tx, ty, v0_offset_f[0], v1_offset_f[0], v2_offset_f[0], v3_offset_f[0], v0_offset_f[1], v1_offset_f[1], v2_offset_f[1], v3_offset_f[1], v0_offset_f[2], v1_offset_f[2], v2_offset_f[2], v3_offset_f[2], v0_offset_f[3], v1_offset_f[3], v2_offset_f[3], v3_offset_f[3]);

                _mm256_storeu_ps(offset_value_ptr, tx);
                _mm256_storeu_ps(offset_value_ptr + 8, ty);
                offset_value_ptr += 16;
                for (int i = 0; i < 4; i++)
                {
                    _mm256_storeu_ps(offset_value_ptr, v0_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 8, v1_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 16, v2_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 24, v3_offset_f[i]);
                    offset_value_ptr += 32;
                }
                gridptr += 16;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_y = unormalize(src.h, sample_y);

                int x1 = floorf(sample_x);
                int y1 = floorf(sample_y);
                int x0 = x1 - 1;
                int x2 = x1 + 1;
                int x3 = x1 + 2;

                offset_value_ptr[0] = sample_x - static_cast<float>(x1);
                offset_value_ptr[1] = sample_y - static_cast<float>(y1);

                x1 = get_coord(src.w, x1);
                x0 = get_coord(src.w, x0);
                x2 = get_coord(src.w, x2);
                x3 = get_coord(src.w, x3);

                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool x2_in_range = (x2 > -1) & (x2 < src.w);
                bool x3_in_range = (x3 > -1) & (x3 < src.w);

                int* offset_ptr = (int*)offset_value_ptr + 2;

                for (int i = 0; i < 4; i++)
                {
                    int gy = y1 + i - 1;
                    gy = get_coord(src.h, gy);
                    int offset_y = gy * src.w;

                    bool y_in_range = (gy > -1) & (gy < src.h);

                    bool v0_in_bound = (x0_in_range & y_in_range);
                    bool v1_in_bound = (x1_in_range & y_in_range);
                    bool v2_in_bound = (x2_in_range & y_in_range);
                    bool v3_in_bound = (x3_in_range & y_in_range);

                    offset_ptr[0] = v0_in_bound ? (offset_y + x0) * src.elempack : -1.0;
                    offset_ptr[1] = v1_in_bound ? (offset_y + x1) * src.elempack : -1.0;
                    offset_ptr[2] = v2_in_bound ? (offset_y + x2) * src.elempack : -1.0;
                    offset_ptr[3] = v3_in_bound ? (offset_y + x3) * src.elempack : -1.0;

                    offset_ptr += 4;
                }

                gridptr += 2;
                offset_value_ptr += 18;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gy = unormalize(_mm256_set1_ps(src.h), gy);

            __m256 gx_floor = _mm256_floor_ps(gx);
            __m256 gy_floor = _mm256_floor_ps(gy);

            __m256 tx = _mm256_sub_ps(gx, gx_floor);
            __m256 ty = _mm256_sub_ps(gy, gy_floor);

            __m256 gx0 = _mm256_add_ps(gx_floor, _mm256_set1_ps(-1));
            __m256 gx1 = gx_floor;
            __m256 gx2 = _mm256_add_ps(gx_floor, _mm256_set1_ps(1));
            __m256 gx3 = _mm256_add_ps(gx2, _mm256_set1_ps(1));

            gx0 = get_coord(_mm256_set1_ps(src.w), gx0);
            gx1 = get_coord(_mm256_set1_ps(src.w), gx1);
            gx2 = get_coord(_mm256_set1_ps(src.w), gx2);
            gx3 = get_coord(_mm256_set1_ps(src.w), gx3);

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(gx0, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx0, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(gx1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx1, _CMP_GT_OS));
            __m256 x2_in_range = _mm256_and_ps(_mm256_cmp_ps(gx2, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx2, _CMP_GT_OS));
            __m256 x3_in_range = _mm256_and_ps(_mm256_cmp_ps(gx3, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx3, _CMP_GT_OS));

            __m256 v0_offset_f[4], v1_offset_f[4], v2_offset_f[4], v3_offset_f[4];
            for (int i = 0; i < 4; i++)
            {
                gy = _mm256_add_ps(gy_floor, _mm256_set1_ps(-1.0f + i));
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 y_in_range = _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS));

                __m256 gy_offset = _mm256_mul_ps(gy, _mm256_set1_ps(src.w));

                v0_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx0), _mm256_set1_ps(src.elempack));
                v1_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx1), _mm256_set1_ps(src.elempack));
                v2_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx2), _mm256_set1_ps(src.elempack));
                v3_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx3), _mm256_set1_ps(src.elempack));

                v0_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v0_offset_f[i], _mm256_and_ps(x0_in_range, y_in_range));
                v1_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v1_offset_f[i], _mm256_and_ps(x1_in_range, y_in_range));
                v2_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v2_offset_f[i], _mm256_and_ps(x2_in_range, y_in_range));
                v3_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v3_offset_f[i], _mm256_and_ps(x3_in_range, y_in_range));

                v0_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v0_offset_f[i]));
                v1_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v1_offset_f[i]));
                v2_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v2_offset_f[i]));
                v3_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v3_offset_f[i]));
            }

            transpose8x18_ps(tx, ty, v0_offset_f[0], v1_offset_f[0], v2_offset_f[0], v3_offset_f[0], v0_offset_f[1], v1_offset_f[1], v2_offset_f[1], v3_offset_f[1], v0_offset_f[2], v1_offset_f[2], v2_offset_f[2], v3_offset_f[2], v0_offset_f[3], v1_offset_f[3], v2_offset_f[3], v3_offset_f[3]);

            _mm256_storeu_ps(offset_value_ptr, tx);
            _mm256_storeu_ps(offset_value_ptr + 8, ty);
            offset_value_ptr += 16;
            for (int i = 0; i < 4; i++)
            {
                _mm256_storeu_ps(offset_value_ptr, v0_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 8, v1_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 16, v2_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 24, v3_offset_f[i]);
                offset_value_ptr += 32;
            }

            gridptr_x += 8;
            gridptr_y += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_y = unormalize(src.h, sample_y);

            int x1 = floorf(sample_x);
            int y1 = floorf(sample_y);
            int x0 = x1 - 1;
            int x2 = x1 + 1;
            int x3 = x1 + 2;

            offset_value_ptr[0] = sample_x - static_cast<float>(x1);
            offset_value_ptr[1] = sample_y - static_cast<float>(y1);

            x1 = get_coord(src.w, x1);
            x0 = get_coord(src.w, x0);
            x2 = get_coord(src.w, x2);
            x3 = get_coord(src.w, x3);

            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool x2_in_range = (x2 > -1) & (x2 < src.w);
            bool x3_in_range = (x3 > -1) & (x3 < src.w);

            int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int i = 0; i < 4; i++)
            {
                int gy = y1 + i - 1;
                gy = get_coord(src.h, gy);
                int offset_y = gy * src.w;

                bool y_in_range = (gy > -1) & (gy < src.h);

                bool v0_in_bound = (x0_in_range & y_in_range);
                bool v1_in_bound = (x1_in_range & y_in_range);
                bool v2_in_bound = (x2_in_range & y_in_range);
                bool v3_in_bound = (x3_in_range & y_in_range);

                offset_ptr[0] = v0_in_bound ? (offset_y + x0) * src.elempack : -1.0;
                offset_ptr[1] = v1_in_bound ? (offset_y + x1) * src.elempack : -1.0;
                offset_ptr[2] = v2_in_bound ? (offset_y + x2) * src.elempack : -1.0;
                offset_ptr[3] = v3_in_bound ? (offset_y + x3) * src.elempack : -1.0;

                offset_ptr += 4;
            }

            gridptr_x++;
            gridptr_y++;

            offset_value_ptr += 18;
        }
    }
}